

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

PtexCachedReader * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::get
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this,StringKey *key)

{
  Entry *pEVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  do {
    pEVar1 = this->_entries;
  } while (pEVar1 == (Entry *)0x0);
  uVar3 = this->_numEntries - 1;
  uVar5 = key->_hash;
  uVar4 = (ulong)(uVar5 & uVar3);
  bVar2 = StringKey::matches(&pEVar1[uVar4].key,key);
  while( true ) {
    if (bVar2) {
      return pEVar1[uVar4].value;
    }
    uVar5 = uVar5 + 1;
    if (pEVar1[uVar4].value == (PtexCachedReader *)0x0) break;
    uVar4 = (ulong)(uVar5 & uVar3);
    bVar2 = StringKey::matches(&pEVar1[uVar4].key,key);
  }
  return (PtexCachedReader *)0x0;
}

Assistant:

Value get(Key& key)
    {
        uint32_t mask = _numEntries-1;
        Entry* entries = getEntries();
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
            if (e.value == 0) {
                break;
            }
        }

        return result;
    }